

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::EmitAddtlInfo_SnapSetInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapSetInfo *pSVar1;
  uint32 i;
  ulong uVar2;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
                     (snpObject);
  FileWriter::WriteLengthValue(writer,pSVar1->SetSize,CommaAndBigSpaceSeparator);
  if (pSVar1->SetSize != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    for (uVar2 = 0; uVar2 < pSVar1->SetSize; uVar2 = uVar2 + 1) {
      NSSnapValues::EmitTTDVar(pSVar1->SetValueArray[uVar2],writer,(uVar2 == 0) + CommaSeparator);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  return;
}

Assistant:

void EmitAddtlInfo_SnapSetInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapSetInfo* setInfo = SnapObjectGetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(snpObject);

            writer->WriteLengthValue(setInfo->SetSize, NSTokens::Separator::CommaAndBigSpaceSeparator);

            if(setInfo->SetSize > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < setInfo->SetSize; ++i)
                {
                    NSSnapValues::EmitTTDVar(setInfo->SetValueArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::BigSpaceSeparator);
                }
                writer->WriteSequenceEnd();
            }
        }